

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_column.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
Unordered_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
::clear(Unordered_set_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
        *this,ID_index rowIndex)

{
  const_iterator __it;
  long lVar1;
  long *plVar2;
  node_ptr plVar3;
  node_ptr plVar4;
  node_ptr next;
  __node_base_ptr p_Var5;
  void *pvVar6;
  Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>
  *entry;
  key_type local_28;
  
  local_28 = (key_type)operator_new(0x20);
  (local_28->super_Entry_column_index_option).columnIndex_ = 0xffffffff;
  (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_ = (node_ptr)0x0;
  (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_ = (node_ptr)0x0;
  local_28->rowIndex_ = rowIndex;
  p_Var5 = std::
           _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
           ::_M_find_before_node
                     (&(this->column_)._M_h,(ulong)rowIndex % (this->column_)._M_h._M_bucket_count,
                      &local_28,(ulong)rowIndex);
  if ((p_Var5 == (__node_base_ptr)0x0) ||
     (__it.
      super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
      ._M_cur = (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
                 )p_Var5->_M_nxt,
     __it.
     super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
     ._M_cur == (__node_type *)0x0)) goto LAB_001bbe57;
  pvVar6 = *(void **)((long)__it.
                            super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
                            ._M_cur + 8);
  if ((this->super_Row_access_option).rows_ == (Row_container *)0x0) {
LAB_001bbe25:
    if (pvVar6 == (void *)0x0) {
      pvVar6 = (void *)0x0;
    }
    else {
      lVar1 = *(long *)((long)pvVar6 + 8);
      if (lVar1 != 0) {
        plVar2 = *(long **)((long)pvVar6 + 0x10);
        *plVar2 = lVar1;
        *(long **)(lVar1 + 8) = plVar2;
      }
    }
  }
  else {
    lVar1 = *(long *)((long)pvVar6 + 8);
    if (lVar1 != 0) {
      plVar2 = *(long **)((long)pvVar6 + 0x10);
      *plVar2 = lVar1;
      *(long **)(lVar1 + 8) = plVar2;
      *(undefined8 *)((long)pvVar6 + 8) = 0;
      *(undefined8 *)((long)pvVar6 + 0x10) = 0;
      pvVar6 = *(void **)((long)__it.
                                super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_true>
                                ._M_cur + 8);
      goto LAB_001bbe25;
    }
  }
  operator_delete(pvVar6,0x20);
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_true,_true,_true>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::erase(&(this->column_)._M_h,__it);
LAB_001bbe57:
  if ((local_28 != (key_type)0x0) &&
     (plVar3 = (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.next_,
     plVar3 != (node_ptr)0x0)) {
    plVar4 = (local_28->super_Row_hook).super_type.super_type.super_list_node<void_*>.prev_;
    plVar4->next_ = plVar3;
    plVar3->prev_ = plVar4;
  }
  operator_delete(local_28,0x20);
  return;
}

Assistant:

inline void Unordered_set_column<Master_matrix>::clear(ID_index rowIndex)
{
  static_assert(!Master_matrix::isNonBasic || Master_matrix::Option_list::is_of_boundary_type,
                "Method not available for chain columns.");

  auto entry = entryPool_->construct(rowIndex);
  auto it = column_.find(entry);
  if (it != column_.end()) {
    _delete_entry(it);
  }
  entryPool_->destroy(entry);
}